

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::HandlePackageMode
          (cmFindPackageCommand *this,HandlePackageModeType handlePackageModeType)

{
  cmMakefile *pcVar1;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  string *psVar6;
  ulong uVar7;
  ostream *poVar8;
  const_iterator begin;
  size_type sVar9;
  reference pvVar10;
  char *pcVar11;
  reference pCVar12;
  char *local_ad0;
  ConfigFileInfo *i;
  iterator __end1;
  iterator __begin1;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *__range1;
  char *sep;
  string consideredVersions;
  string consideredConfigFiles;
  string consideredVersionsVar;
  string consideredConfigsVar;
  string fileVar;
  undefined1 local_740 [8];
  ostringstream aw_1;
  string local_5c8;
  string local_5a8 [32];
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  string local_4d0 [8];
  string requestedVersionString;
  ConfigFileInfo *info;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  __end5;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  __begin5;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  local_488;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  *local_478;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  *__range5;
  const_iterator duplicate_end;
  ostringstream aw;
  undefined1 local_2f0 [8];
  ostringstream e;
  allocator<char> local_171;
  string local_170;
  byte local_14b;
  byte local_14a;
  byte local_149;
  string local_148 [5];
  bool configFileSetFOUNDFalse;
  bool found;
  bool result;
  string notFoundMessage;
  string notFoundMessageVar;
  string foundVar;
  string local_e0;
  undefined1 local_c0 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string dir;
  char *pcStack_20;
  bool fileFound;
  char *def;
  HandlePackageModeType handlePackageModeType_local;
  cmFindPackageCommand *this_local;
  
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::clear(&this->ConsideredConfigs);
  pcStack_20 = cmMakefile::GetDefinition
                         ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  dir.field_2._M_local_buf[0xf] = '\0';
  if ((this->UseConfigFiles & 1U) != 0) {
    bVar3 = cmSystemTools::IsOff(pcStack_20);
    if (!bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcStack_20,&local_49);
      std::allocator<char>::~allocator(&local_49);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
      bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_48);
      if (!bVar3) {
        std::operator+(&local_80,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::__cxx11::string::operator=((string *)local_48,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&file.field_2 + 8),psVar6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::__cxx11::string::operator=
                  ((string *)local_48,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)local_c0);
      bVar3 = FindConfigFile(this,(string *)local_48,(string *)local_c0);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)&this->FileFound,(string *)local_c0);
        dir.field_2._M_local_buf[0xf] = '\x01';
      }
      pcStack_20 = cmMakefile::GetDefinition
                             ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)local_48);
    }
    bVar3 = cmSystemTools::IsOff(pcStack_20);
    if ((bVar3) || ((dir.field_2._M_local_buf[0xf] & 1U) == 0)) {
      dir.field_2._M_local_buf[0xf] = FindConfig(this);
    }
    if (((dir.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"fileFound is true but FileFound is empty!",
                 (allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      dir.field_2._M_local_buf[0xf] = '\0';
    }
  }
  std::__cxx11::string::string
            ((string *)(notFoundMessageVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)(notFoundMessageVar.field_2._M_local_buf + 8),"_FOUND")
  ;
  std::__cxx11::string::string
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),"_NOT_FOUND_MESSAGE");
  std::__cxx11::string::string(local_148);
  local_149 = 1;
  local_14a = 0;
  local_14b = 0;
  if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
    bVar3 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,
                       (string *)((long)&notFoundMessageVar.field_2 + 8));
    if ((bVar3) &&
       (bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar3)) {
      cmMakefile::RemoveDefinition
                ((this->super_cmFindCommon).super_cmCommand.Makefile,
                 (string *)((long)&notFoundMessageVar.field_2 + 8));
    }
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&notFoundMessage.field_2 + 8));
    StoreVersionFound(this);
    bVar3 = ReadListFile(this,&this->FileFound,DoPolicyScope);
    if (bVar3) {
      local_14a = 1;
      bVar3 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,
                         (string *)((long)&notFoundMessageVar.field_2 + 8));
      if ((bVar3) &&
         (bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                   (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar3)) {
        local_14a = 0;
        local_14b = 1;
        psVar6 = cmMakefile::GetSafeDefinition
                           ((this->super_cmFindCommon).super_cmCommand.Makefile,
                            (string *)((long)&notFoundMessage.field_2 + 8));
        std::__cxx11::string::operator=(local_148,(string *)psVar6);
      }
    }
    else {
      local_149 = 0;
    }
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CMAKE_FIND_PACKAGE_PREFER_CONFIG",&local_171);
  bVar4 = cmMakefile::IsOn(pcVar1,&local_170);
  bVar3 = false;
  if ((bVar4) && (bVar3 = false, (local_14a & 1) == 0)) {
    bVar3 = handlePackageModeType == Config;
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  cVar2.End._M_current = local_488.End._M_current;
  cVar2.Begin._M_current = local_488.Begin._M_current;
  if (bVar3) {
    local_149 = 0;
  }
  if (((local_149 & 1) != 0) && (local_488 = cVar2, (local_14a & 1) == 0)) {
    if (((this->Required & 1U) == 0) &&
       (((this->Quiet & 1U) != 0 ||
        ((((this->UseConfigFiles & 1U) != 0 && ((this->UseFindModules & 1U) == 0)) &&
         (bVar3 = std::
                  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ::empty(&this->ConsideredConfigs), bVar3)))))) {
      if ((this->Quiet & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_740);
        poVar8 = std::operator<<((ostream *)local_740,"Could NOT find ");
        poVar8 = std::operator<<(poVar8,(string *)&this->Name);
        poVar8 = std::operator<<(poVar8," (missing: ");
        poVar8 = std::operator<<(poVar8,(string *)&this->Name);
        std::operator<<(poVar8,"_DIR)");
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::DisplayStatus(pcVar1,(string *)((long)&fileVar.field_2 + 8),-1.0);
        std::__cxx11::string::~string((string *)(fileVar.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_740);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&duplicate_end);
      if ((local_14b & 1) == 0) {
        bVar3 = std::
                vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                ::empty(&this->ConsideredConfigs);
        if (bVar3) {
          std::__cxx11::string::string(local_4d0);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::operator=(local_4d0," (requested version ");
            std::__cxx11::string::operator+=(local_4d0,(string *)&this->Version);
            std::__cxx11::string::operator+=(local_4d0,")");
          }
          if ((this->UseConfigFiles & 1U) == 0) {
            poVar8 = std::operator<<((ostream *)local_2f0,"No \"Find");
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            poVar8 = std::operator<<(poVar8,".cmake\" found in ");
            std::operator<<(poVar8,"CMAKE_MODULE_PATH.");
            poVar8 = std::operator<<((ostream *)&duplicate_end,"Find");
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            poVar8 = std::operator<<(poVar8,
                                     ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                                    );
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            std::operator<<(poVar8,
                            ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
                           );
          }
          else {
            if ((this->UseFindModules & 1U) != 0) {
              poVar8 = std::operator<<((ostream *)local_2f0,"By not providing \"Find");
              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
              poVar8 = std::operator<<(poVar8,
                                       ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                                      );
              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
              std::operator<<(poVar8,"\", but CMake did not find one.\n");
            }
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->Configs);
            if (sVar9 == 1) {
              poVar8 = std::operator<<((ostream *)local_2f0,
                                       "Could not find a package configuration file named \"");
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&this->Configs,0);
              poVar8 = std::operator<<(poVar8,(string *)pvVar10);
              poVar8 = std::operator<<(poVar8,"\" provided by package \"");
              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
              poVar8 = std::operator<<(poVar8,"\"");
              poVar8 = std::operator<<(poVar8,local_4d0);
              std::operator<<(poVar8,".\n");
            }
            else {
              poVar8 = std::operator<<((ostream *)local_2f0,
                                       "Could not find a package configuration file provided by \"")
              ;
              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
              poVar8 = std::operator<<(poVar8,"\"");
              poVar8 = std::operator<<(poVar8,local_4d0);
              poVar8 = std::operator<<(poVar8," with any of the following names:\n");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_510,"  ",&local_511);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"",&local_539)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_560,"\n",&local_561);
              cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_4f0,&local_510,&this->Configs,&local_538,&local_560);
              poVar8 = std::operator<<(poVar8,(string *)&local_4f0);
              std::operator<<(poVar8,"\n");
              std::__cxx11::string::~string((string *)&local_4f0);
              std::__cxx11::string::~string((string *)&local_560);
              std::allocator<char>::~allocator(&local_561);
              std::__cxx11::string::~string((string *)&local_538);
              std::allocator<char>::~allocator(&local_539);
              std::__cxx11::string::~string((string *)&local_510);
              std::allocator<char>::~allocator(&local_511);
            }
            poVar8 = std::operator<<((ostream *)local_2f0,"Add the installation prefix of \"");
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            poVar8 = std::operator<<(poVar8,"\" to CMAKE_PREFIX_PATH or set \"");
            poVar8 = std::operator<<(poVar8,(string *)&this->Variable);
            poVar8 = std::operator<<(poVar8,
                                     "\" to a directory containing one of the above files. If \"");
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            std::operator<<(poVar8,
                            "\" provides a separate development package or SDK, be sure it has been installed."
                           );
          }
          std::__cxx11::string::~string(local_4d0);
        }
        else {
          __range5 = (cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                      *)cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
                                  (&this->ConsideredConfigs);
          poVar8 = std::operator<<((ostream *)local_2f0,
                                   "Could not find a configuration file for package \"");
          poVar8 = std::operator<<(poVar8,(string *)&this->Name);
          poVar8 = std::operator<<(poVar8,"\" that ");
          pcVar11 = "is compatible with";
          if ((this->VersionExact & 1U) != 0) {
            pcVar11 = "exactly matches";
          }
          poVar8 = std::operator<<(poVar8,pcVar11);
          poVar8 = std::operator<<(poVar8," requested version \"");
          poVar8 = std::operator<<(poVar8,(string *)&this->Version);
          poVar8 = std::operator<<(poVar8,"\".\n");
          std::operator<<(poVar8,
                          "The following configuration files were considered but not accepted:\n");
          begin = std::
                  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ::cbegin(&this->ConsideredConfigs);
          local_488 = cmMakeRange<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>
                                ((__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                  )begin._M_current,
                                 (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                  )__range5);
          local_478 = &local_488;
          __end5 = cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                   ::begin(local_478);
          info = (ConfigFileInfo *)
                 cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                 ::end(local_478);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                        *)&info);
            if (!bVar3) break;
            requestedVersionString.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                 ::operator*(&__end5);
            poVar8 = std::operator<<((ostream *)local_2f0,"  ");
            poVar8 = std::operator<<(poVar8,(string *)requestedVersionString.field_2._8_8_);
            poVar8 = std::operator<<(poVar8,", version: ");
            poVar8 = std::operator<<(poVar8,(string *)(requestedVersionString.field_2._8_8_ + 0x20))
            ;
            std::operator<<(poVar8,"\n");
            __gnu_cxx::
            __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
            ::operator++(&__end5);
          }
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)local_2f0,"Found package configuration file:\n  ");
        poVar8 = std::operator<<(poVar8,(string *)&this->FileFound);
        poVar8 = std::operator<<(poVar8,"\nbut it set ");
        poVar8 = std::operator<<(poVar8,(string *)(notFoundMessageVar.field_2._M_local_buf + 8));
        poVar8 = std::operator<<(poVar8," to FALSE so package \"");
        poVar8 = std::operator<<(poVar8,(string *)&this->Name);
        std::operator<<(poVar8,"\" is considered to be NOT FOUND.");
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          poVar8 = std::operator<<((ostream *)local_2f0," Reason given by package: \n");
          poVar8 = std::operator<<(poVar8,local_148);
          std::operator<<(poVar8,"\n");
        }
      }
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      bVar3 = this->Required;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,((byte)~bVar3 & 1) * 3 + FATAL_ERROR,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      if ((this->Required & 1U) != 0) {
        cmSystemTools::SetFatalErrorOccured();
      }
      std::__cxx11::ostringstream::str();
      bVar5 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_5a8);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&duplicate_end);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
    }
  }
  if ((local_14a & 1) == 0) {
    local_ad0 = "0";
  }
  else {
    local_ad0 = "1";
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,
             (string *)((long)&notFoundMessageVar.field_2 + 8),local_ad0);
  std::__cxx11::string::string
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),"_CONFIG");
  if ((local_14a & 1) == 0) {
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&consideredConfigsVar.field_2 + 8));
  }
  else {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigsVar.field_2 + 8),pcVar11);
  }
  std::__cxx11::string::string
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),"_CONSIDERED_CONFIGS");
  std::__cxx11::string::string
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),"_CONSIDERED_VERSIONS");
  std::__cxx11::string::string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&sep);
  __range1 = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              *)0x8535f0;
  __end1 = std::
           vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ::begin(&this->ConsideredConfigs);
  i = (ConfigFileInfo *)
      std::
      vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ::end(&this->ConsideredConfigs);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                *)&i);
    if (!bVar3) break;
    pCVar12 = __gnu_cxx::
              __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              ::operator*(&__end1);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(char *)__range1);
    std::__cxx11::string::operator+=((string *)&sep,(char *)__range1);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(string *)pCVar12);
    std::__cxx11::string::operator+=((string *)&sep,(string *)&pCVar12->version);
    __range1 = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                *)0x8416a3;
    __gnu_cxx::
    __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
    ::operator++(&__end1);
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar11 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredVersionsVar.field_2 + 8),pcVar11);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar11 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigFiles.field_2 + 8),pcVar11);
  bVar5 = local_149;
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigFiles.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredVersionsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)(notFoundMessage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(notFoundMessageVar.field_2._M_local_buf + 8));
  return (bool)(bVar5 & 1);
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode(
  HandlePackageModeType handlePackageModeType)
{
  this->ConsideredConfigs.clear();

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir)) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound, DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  if (this->Makefile->IsOn("CMAKE_FIND_PACKAGE_PREFER_CONFIG") && !found &&
      handlePackageModeType == HandlePackageModeType::Config) {
    // Config mode failed. Allow Module case.
    result = false;
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet ||
          (this->UseConfigFiles && !this->UseFindModules &&
           this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";

        for (ConfigFileInfo const& info :
             cmMakeRange(this->ConsideredConfigs.cbegin(), duplicate_end)) {
          e << "  " << info.filename << ", version: " << info.version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name
              << "\", "
                 "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name
            << "\" provides a separate development "
               "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(this->Required ? MessageType::FATAL_ERROR
                                                  : MessageType::WARNING,
                                   e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (ConfigFileInfo const& i : this->ConsideredConfigs) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i.filename;
    consideredVersions += i.version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}